

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3VdbeSerialGet(uchar *buf,u32 serial_type,Mem *pMem)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  u16 uVar5;
  uint uVar6;
  ulong uVar7;
  MemValue MVar8;
  uint uVar9;
  
  switch(serial_type) {
  case 0:
  case 0xb:
    pMem->flags = 1;
    return;
  case 1:
    uVar7 = (ulong)(char)*buf;
    break;
  case 2:
    uVar7 = (long)(char)*buf << 8;
    bVar1 = buf[1];
    goto LAB_0014f200;
  case 3:
    uVar7 = (ulong)buf[2] | (ulong)buf[1] << 8 | (long)(char)*buf << 0x10;
    break;
  case 4:
    uVar7 = (ulong)buf[2] << 8 | (ulong)buf[1] << 0x10 | (long)(char)*buf << 0x18;
    bVar1 = buf[3];
LAB_0014f200:
    (pMem->u).i = bVar1 | uVar7;
    goto LAB_0014f22a;
  case 5:
    uVar4 = *(uint *)(buf + 2);
    MVar8.i._4_4_ = (int)CONCAT11(*buf,buf[1]);
    MVar8.nZero = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
    goto LAB_0014f1bf;
  case 6:
  case 7:
    bVar1 = buf[1];
    uVar4 = (uint)bVar1 << 0x10 | (uint)*buf << 0x18;
    uVar9 = (uint)(ushort)(*(ushort *)(buf + 2) << 8 | *(ushort *)(buf + 2) >> 8);
    uVar6 = (uint)buf[5] << 0x10 | (uint)buf[4] << 0x18;
    bVar2 = buf[6];
    bVar3 = buf[7];
    uVar7 = CONCAT44(uVar9 | uVar4,uVar6) | (ulong)bVar3 | (ulong)bVar2 << 8;
    if (serial_type == 6) {
      (pMem->u).i = uVar7;
      uVar5 = 4;
    }
    else {
      (pMem->u).i = uVar7;
      uVar5 = 1;
      if (((uVar6 == 0 && (uVar9 == 0 && ((uint)bVar1 << 0x10 & 0xfffff) == 0)) && (ulong)bVar3 == 0
          ) && (ulong)bVar2 == 0) {
        uVar5 = 8;
      }
      if ((~uVar4 & 0x7ff00000) != 0) {
        uVar5 = 8;
      }
    }
    pMem->flags = uVar5;
    return;
  case 8:
  case 9:
    MVar8.nZero = serial_type - 8;
    MVar8.i._4_4_ = 0;
LAB_0014f1bf:
    pMem->u = MVar8;
    goto LAB_0014f22a;
  case 10:
    pMem->flags = 0x401;
    pMem->n = 0;
    (pMem->u).nZero = 0;
    return;
  default:
    pMem->z = (char *)buf;
    pMem->n = serial_type - 0xc >> 1;
    pMem->flags = sqlite3VdbeSerialGet::aFlag[serial_type & 1];
    return;
  }
  (pMem->u).i = uVar7;
LAB_0014f22a:
  pMem->flags = 4;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeSerialGet(
  const unsigned char *buf,     /* Buffer to deserialize from */
  u32 serial_type,              /* Serial type to deserialize */
  Mem *pMem                     /* Memory cell to write value into */
){
  switch( serial_type ){
    case 10: { /* Internal use only: NULL with virtual table
               ** UPDATE no-change flag set */
      pMem->flags = MEM_Null|MEM_Zero;
      pMem->n = 0;
      pMem->u.nZero = 0;
      return;
    }
    case 11:   /* Reserved for future use */
    case 0: {  /* Null */
      /* EVIDENCE-OF: R-24078-09375 Value is a NULL. */
      pMem->flags = MEM_Null;
      return;
    }
    case 1: {
      /* EVIDENCE-OF: R-44885-25196 Value is an 8-bit twos-complement
      ** integer. */
      pMem->u.i = ONE_BYTE_INT(buf);
      pMem->flags = MEM_Int;
      testcase( pMem->u.i<0 );
      return;
    }
    case 2: { /* 2-byte signed integer */
      /* EVIDENCE-OF: R-49794-35026 Value is a big-endian 16-bit
      ** twos-complement integer. */
      pMem->u.i = TWO_BYTE_INT(buf);
      pMem->flags = MEM_Int;
      testcase( pMem->u.i<0 );
      return;
    }
    case 3: { /* 3-byte signed integer */
      /* EVIDENCE-OF: R-37839-54301 Value is a big-endian 24-bit
      ** twos-complement integer. */
      pMem->u.i = THREE_BYTE_INT(buf);
      pMem->flags = MEM_Int;
      testcase( pMem->u.i<0 );
      return;
    }
    case 4: { /* 4-byte signed integer */
      /* EVIDENCE-OF: R-01849-26079 Value is a big-endian 32-bit
      ** twos-complement integer. */
      pMem->u.i = FOUR_BYTE_INT(buf);
#ifdef __HP_cc
      /* Work around a sign-extension bug in the HP compiler for HP/UX */
      if( buf[0]&0x80 ) pMem->u.i |= 0xffffffff80000000LL;
#endif
      pMem->flags = MEM_Int;
      testcase( pMem->u.i<0 );
      return;
    }
    case 5: { /* 6-byte signed integer */
      /* EVIDENCE-OF: R-50385-09674 Value is a big-endian 48-bit
      ** twos-complement integer. */
      pMem->u.i = FOUR_BYTE_UINT(buf+2) + (((i64)1)<<32)*TWO_BYTE_INT(buf);
      pMem->flags = MEM_Int;
      testcase( pMem->u.i<0 );
      return;
    }
    case 6:   /* 8-byte signed integer */
    case 7: { /* IEEE floating point */
      /* These use local variables, so do them in a separate routine
      ** to avoid having to move the frame pointer in the common case */
      serialGet(buf,serial_type,pMem);
      return;
    }
    case 8:    /* Integer 0 */
    case 9: {  /* Integer 1 */
      /* EVIDENCE-OF: R-12976-22893 Value is the integer 0. */
      /* EVIDENCE-OF: R-18143-12121 Value is the integer 1. */
      pMem->u.i = serial_type-8;
      pMem->flags = MEM_Int;
      return;
    }
    default: {
      /* EVIDENCE-OF: R-14606-31564 Value is a BLOB that is (N-12)/2 bytes in
      ** length.
      ** EVIDENCE-OF: R-28401-00140 Value is a string in the text encoding and
      ** (N-13)/2 bytes in length. */
      static const u16 aFlag[] = { MEM_Blob|MEM_Ephem, MEM_Str|MEM_Ephem };
      pMem->z = (char *)buf;
      pMem->n = (serial_type-12)/2;
      pMem->flags = aFlag[serial_type&1];
      return;
    }
  }
  return;
}